

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserSamTest_CompressedFormatError_Test::
~BioparserSamTest_CompressedFormatError_Test(BioparserSamTest_CompressedFormatError_Test *this)

{
  BioparserSamTest_CompressedFormatError_Test *this_local;
  
  BioparserSamTest::~BioparserSamTest(&this->super_BioparserSamTest);
  return;
}

Assistant:

TEST_F(BioparserSamTest, CompressedFormatError) {
  Setup("sample.paf.gz");
  try {
    o = p->Parse(-1);
  } catch (std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[bioparser::SamParser] error: invalid file format");
  }
}